

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gog.cpp
# Opt level: O0

size_t gog::anon_unknown_0::probe_bin_file_series
                 (extract_options *o,info *info,path *dir,string *basename,size_t format,
                 size_t start)

{
  bool bVar1;
  vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *in_RDX;
  long in_RDI;
  long in_R8;
  info *in_stack_00000190;
  extract_options *in_stack_00000198;
  vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *in_stack_000001a0;
  path file;
  size_t i;
  vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> files;
  size_t count;
  path *in_stack_fffffffffffffd08;
  logger *in_stack_fffffffffffffd10;
  undefined7 in_stack_fffffffffffffd18;
  vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
  *in_stack_fffffffffffffd20;
  path *in_stack_fffffffffffffd30;
  path *in_stack_fffffffffffffd38;
  logger *in_stack_fffffffffffffe40;
  string local_128 [48];
  size_t in_stack_ffffffffffffff08;
  size_t in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  size_t local_38;
  
  local_38 = 0;
  std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::vector
            ((vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *)0x13fc60);
  do {
    std::_Construct<std::__cxx11::string>((path *)0x13fc7d);
    if (in_R8 == 0) {
      std::_Construct<std::__cxx11::string,std::__cxx11::string_const&>
                ((path *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      boost::filesystem::operator/(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
      boost::filesystem::path::operator=
                ((path *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      std::_Destroy<std::__cxx11::string>((path *)0x13fcee);
      std::_Destroy<std::__cxx11::string>((path *)0x13fcfb);
    }
    else {
      in_stack_fffffffffffffd20 = in_RDX;
      stream::slice_reader::slice_filename
                (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      std::_Construct<std::__cxx11::string,std::__cxx11::string_const&>
                ((path *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      boost::filesystem::operator/(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
      boost::filesystem::path::operator=
                ((path *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      std::_Destroy<std::__cxx11::string>((path *)0x13fdc8);
      std::_Destroy<std::__cxx11::string>((path *)0x13fdd5);
      std::__cxx11::string::~string(local_128);
    }
    bVar1 = boost::filesystem::is_regular_file((path *)in_stack_fffffffffffffd10);
    if (bVar1) {
      if ((*(byte *)(in_RDI + 0xf) & 1) == 0) {
        logger::logger(in_stack_fffffffffffffd10,
                       (log_level)((ulong)in_stack_fffffffffffffd08 >> 0x20));
        boost::filesystem::path::filename();
        in_stack_fffffffffffffd10 =
             logger::operator<<(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
        logger::operator<<(in_stack_fffffffffffffd10,(char (*) [10])in_stack_fffffffffffffd08);
        std::_Destroy<std::__cxx11::string>((path *)0x13ff16);
        logger::~logger(in_stack_fffffffffffffe40);
        local_38 = local_38 + 1;
      }
      else {
        std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::push_back
                  (in_stack_fffffffffffffd20,(value_type *)CONCAT17(bVar1,in_stack_fffffffffffffd18)
                  );
      }
      if (in_R8 == 0) {
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
    }
    else {
      bVar1 = true;
    }
    std::_Destroy<std::__cxx11::string>((path *)0x13ffa6);
  } while (!bVar1);
  bVar1 = std::vector<setup::language_entry,_std::allocator<setup::language_entry>_>::empty
                    ((vector<setup::language_entry,_std::allocator<setup::language_entry>_> *)
                     in_stack_fffffffffffffd20);
  if (!bVar1) {
    process_bin_files(in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  }
  std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::~vector
            (in_stack_fffffffffffffd20);
  return local_38;
}

Assistant:

size_t probe_bin_file_series(const extract_options & o, const setup::info & info, const fs::path & dir,
                             const std::string & basename, size_t format = 0, size_t start = 0) {
	
	size_t count = 0;
	
	std::vector<fs::path> files;
	
	for(size_t i = start;; i++) {
		
		fs::path file;
		if(format == 0) {
			file = dir / basename;
		} else {
			file = dir / stream::slice_reader::slice_filename(basename, i, format);
		}
		
		try {
			if(!fs::is_regular_file(file)) {
				break;
			}
		} catch(...) {
			break;
		}
		
		if(o.gog) {
			files.push_back(file);
		} else {
			log_warning << file.filename() << " is not part of the installer!";
			count++;
		}
		
		if(format == 0) {
			break;
		}
		
	}
	
	if(!files.empty()) {
		process_bin_files(files, o, info);
	}
	
	return count;
}